

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

Au_Obj_t * Au_ObjFanin(Au_Obj_t *p,int i)

{
  int h;
  Au_Ntk_t *p_00;
  Au_Obj_t *pAVar1;
  int i_local;
  Au_Obj_t *p_local;
  
  p_00 = Au_ObjNtk(p);
  h = Au_ObjFaninId(p,i);
  pAVar1 = Au_NtkObj(p_00,h);
  return pAVar1;
}

Assistant:

static inline Au_Obj_t *   Au_ObjFanin( Au_Obj_t * p, int i )            { return Au_NtkObj(Au_ObjNtk(p), Au_ObjFaninId(p, i));                                        }